

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O3

LoadResult
wallet::LoadRecords(CWallet *pwallet,DatabaseBatch *batch,string *key,DataStream *prefix,
                   LoadFunc *load_func)

{
  int iVar1;
  DBErrors DVar2;
  undefined8 uVar3;
  pointer pbVar4;
  DBErrors DVar5;
  ulong uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  DataStream ssKey;
  string error;
  string type;
  long *local_d0;
  DataStream local_c8;
  DataStream local_a8;
  CWallet *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.m_read_pos = 0;
  local_a8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.m_read_pos = 0;
  local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar4 = (prefix->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start + prefix->m_read_pos;
  (*batch->_vptr_DatabaseBatch[10])
            (&local_d0,batch,pbVar4,
             (long)(prefix->vch).
                   super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pbVar4);
  if (local_d0 == (long *)0x0) {
    CWallet::WalletLogPrintf<std::__cxx11::string>(pwallet,(ConstevalFormatString<1U>)0x10eafbc,key)
    ;
    uVar7 = 0;
    uVar6 = 9;
  }
  else {
    DVar5 = LOAD_OK;
    uVar7 = 0;
    while( true ) {
      iVar1 = (**(code **)(*local_d0 + 0x10))(local_d0,&local_a8,&local_c8);
      if (iVar1 == 0) break;
      if (iVar1 == 2) {
        uVar6 = (ulong)DVar5;
        goto LAB_00c3debb;
      }
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      Unserialize<DataStream,char>(&local_a8,&local_58);
      if (local_58._M_string_length != key->_M_string_length) {
LAB_00c3df12:
        __assert_fail("type == key",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp"
                      ,0x209,
                      "LoadResult wallet::LoadRecords(CWallet *, DatabaseBatch &, const std::string &, DataStream &, LoadFunc)"
                     );
      }
      if (local_58._M_string_length != 0) {
        iVar1 = bcmp(local_58._M_dataplus._M_p,(key->_M_dataplus)._M_p,local_58._M_string_length);
        if (iVar1 != 0) goto LAB_00c3df12;
      }
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      local_80 = pwallet;
      if ((load_func->super__Function_base)._M_manager == (_Manager_type)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          uVar3 = std::__throw_bad_function_call();
          if (local_d0 != (long *)0x0) {
            (**(code **)(*local_d0 + 8))();
          }
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_c8);
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_a8);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            _Unwind_Resume(uVar3);
          }
        }
        goto LAB_00c3e007;
      }
      DVar2 = (*load_func->_M_invoker)
                        ((_Any_data *)load_func,&local_80,&local_a8,&local_c8,&local_78);
      if (DVar2 != LOAD_OK) {
        CWallet::WalletLogPrintf<std::__cxx11::string>
                  (pwallet,(ConstevalFormatString<1U>)0x112ee54,&local_78);
      }
      if ((int)DVar5 <= (int)DVar2) {
        DVar5 = DVar2;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      uVar7 = uVar7 + 1;
    }
    uVar6 = 9;
    CWallet::WalletLogPrintf<std::__cxx11::string>(pwallet,(ConstevalFormatString<1U>)0x10eb0f9,key)
    ;
  }
LAB_00c3debb:
  if (local_d0 != (long *)0x0) {
    (**(code **)(*local_d0 + 8))();
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_c8);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (LoadResult)((ulong)uVar7 << 0x20 | uVar6);
  }
LAB_00c3e007:
  __stack_chk_fail();
}

Assistant:

static LoadResult LoadRecords(CWallet* pwallet, DatabaseBatch& batch, const std::string& key, DataStream& prefix, LoadFunc load_func)
{
    LoadResult result;
    DataStream ssKey;
    DataStream ssValue{};

    Assume(!prefix.empty());
    std::unique_ptr<DatabaseCursor> cursor = batch.GetNewPrefixCursor(prefix);
    if (!cursor) {
        pwallet->WalletLogPrintf("Error getting database cursor for '%s' records\n", key);
        result.m_result = DBErrors::CORRUPT;
        return result;
    }

    while (true) {
        DatabaseCursor::Status status = cursor->Next(ssKey, ssValue);
        if (status == DatabaseCursor::Status::DONE) {
            break;
        } else if (status == DatabaseCursor::Status::FAIL) {
            pwallet->WalletLogPrintf("Error reading next '%s' record for wallet database\n", key);
            result.m_result = DBErrors::CORRUPT;
            return result;
        }
        std::string type;
        ssKey >> type;
        assert(type == key);
        std::string error;
        DBErrors record_res = load_func(pwallet, ssKey, ssValue, error);
        if (record_res != DBErrors::LOAD_OK) {
            pwallet->WalletLogPrintf("%s\n", error);
        }
        result.m_result = std::max(result.m_result, record_res);
        ++result.m_records;
    }
    return result;
}